

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

deUint32 deqp::gls::ub::anon_unknown_12::mergeLayoutFlags(deUint32 prevFlags,deUint32 newFlags)

{
  uint local_24;
  uint local_20;
  deUint32 mergedFlags;
  deUint32 matrixMask;
  deUint32 packingMask;
  deUint32 newFlags_local;
  deUint32 prevFlags_local;
  
  local_20 = prevFlags;
  if ((newFlags & 0x38) != 0) {
    local_20 = newFlags;
  }
  local_24 = prevFlags;
  if ((newFlags & 0xc0) != 0) {
    local_24 = newFlags;
  }
  return local_24 & 0xc0 | local_20 & 0x38;
}

Assistant:

inline deUint32 mergeLayoutFlags (deUint32 prevFlags, deUint32 newFlags)
{
	const deUint32	packingMask		= LAYOUT_PACKED|LAYOUT_SHARED|LAYOUT_STD140;
	const deUint32	matrixMask		= LAYOUT_ROW_MAJOR|LAYOUT_COLUMN_MAJOR;

	deUint32 mergedFlags = 0;

	mergedFlags |= ((newFlags & packingMask)	? newFlags : prevFlags) & packingMask;
	mergedFlags |= ((newFlags & matrixMask)		? newFlags : prevFlags) & matrixMask;

	return mergedFlags;
}